

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall cfd::core::Serializer::AddDirectBigEndianNumber(Serializer *this,uint32_t number)

{
  uint uVar1;
  bool bVar2;
  uchar *puVar3;
  undefined4 local_24;
  uint8_t tmp_buf [4];
  uint8_t *buf;
  uint32_t number_local;
  Serializer *this_local;
  
  CheckNeedSize(this,4);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3e74de);
  uVar1 = this->offset_;
  bVar2 = IsBigEndian();
  if (bVar2) {
    *(uint32_t *)(puVar3 + uVar1) = number;
  }
  else {
    local_24 = CONCAT13((char)number,
                        CONCAT12((char)(number >> 8),
                                 CONCAT11((char)(number >> 0x10),(char)(number >> 0x18))));
    *(uint32_t *)(puVar3 + uVar1) = local_24;
  }
  this->offset_ = this->offset_ + 4;
  return;
}

Assistant:

void Serializer::AddDirectBigEndianNumber(uint32_t number) {
  CheckNeedSize(sizeof(number));
  uint8_t* buf = &buffer_.data()[offset_];
  if (IsBigEndian()) {
    memcpy(buf, &number, sizeof(number));
  } else {
    uint8_t tmp_buf[4] = {
        static_cast<uint8_t>((number & 0xff000000) >> 24),
        static_cast<uint8_t>((number & 0x00ff0000) >> 16),
        static_cast<uint8_t>((number & 0x0000ff00) >> 8),
        static_cast<uint8_t>(number & 0x000000ff),
    };
    memcpy(buf, tmp_buf, sizeof(tmp_buf));
  }
  offset_ += sizeof(number);
}